

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O0

void secp256k1_musig_keyagglist_sha256(secp256k1_sha256 *sha)

{
  secp256k1_sha256 *in_RDI;
  
  secp256k1_sha256_initialize(in_RDI);
  in_RDI->s[0] = 0xb399d5e0;
  in_RDI->s[1] = 0xc8fff302;
  in_RDI->s[2] = 0x6badac71;
  in_RDI->s[3] = 0x7c5b7f1;
  in_RDI->s[4] = 0x9701e2ef;
  in_RDI->s[5] = 0x2a72ecf8;
  in_RDI->s[6] = 0x201a4c7b;
  in_RDI->s[7] = 0xab148a38;
  in_RDI->bytes = 0x40;
  return;
}

Assistant:

static void secp256k1_musig_keyagglist_sha256(secp256k1_sha256 *sha) {
    secp256k1_sha256_initialize(sha);

    sha->s[0] = 0xb399d5e0ul;
    sha->s[1] = 0xc8fff302ul;
    sha->s[2] = 0x6badac71ul;
    sha->s[3] = 0x07c5b7f1ul;
    sha->s[4] = 0x9701e2eful;
    sha->s[5] = 0x2a72ecf8ul;
    sha->s[6] = 0x201a4c7bul;
    sha->s[7] = 0xab148a38ul;
    sha->bytes = 64;
}